

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TiledInputFile::rawTileData
          (TiledInputFile *this,int *dx,int *dy,int *lx,int *ly,char **pixelData,int *pixelDataSize)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  ArgExc *pAVar6;
  mutex *__mutex;
  exr_chunk_info_t cinfo;
  stringstream _iex_throw_s;
  undefined1 local_1f8 [4];
  int local_1f4;
  int local_1f0;
  byte local_1e4;
  byte local_1e3;
  int local_1d8;
  undefined4 uStack_1d4;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  iVar3 = exr_read_tile_chunk_info
                    (*(this->_ctxt)._ctxt.
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     ((this->_data).
                      super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->partNumber,*dx,*dy,*lx,*ly,local_1f8);
  if (iVar3 != 0) {
    bVar2 = isValidTile(this,*dx,*dy,*lx,*ly);
    iex_debugTrap();
    if (bVar2) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Error reading chunk information for tile from image file \"",0x3a);
      pcVar4 = Context::fileName(&this->_ctxt);
      poVar5 = std::operator<<(local_1a8,pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"\". Unable to read raw tile offset information.",0x2e);
      pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar6,local_1b8);
      __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Error reading pixel data from image file \"",0x2a);
    pcVar4 = Context::fileName(&this->_ctxt);
    poVar5 = std::operator<<(local_1a8,pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\". ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Tried to read a tile outside the image file\'s data window.",0x3a);
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,local_1b8);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  __mutex = &((this->_data).
              super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_mx;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    std::vector<char,_std::allocator<char>_>::resize
              (&((this->_data).
                 super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_tile_data_scratch,CONCAT44(uStack_1d4,local_1d8));
    *pixelDataSize = local_1d8;
    peVar1 = (this->_data).
             super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = exr_read_chunk(*(this->_ctxt)._ctxt.
                            super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,peVar1->partNumber,local_1f8,
                           (peVar1->_tile_data_scratch).
                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
    if (iVar3 == 0) {
      *pixelData = (((this->_data).
                     super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_tile_data_scratch).super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      *dx = local_1f4;
      *dy = local_1f0;
      *lx = (uint)local_1e4;
      *ly = (uint)local_1e3;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Error reading pixel data from image file \"",0x2a);
    pcVar4 = Context::fileName(&this->_ctxt);
    poVar5 = std::operator<<(local_1a8,pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\". Unable to read raw tile data of ",0x23);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,*pixelDataSize);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," bytes.",7);
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,local_1b8);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void
TiledInputFile::rawTileData (
    int&         dx,
    int&         dy,
    int&         lx,
    int&         ly,
    const char*& pixelData,
    int&         pixelDataSize)
{
    exr_chunk_info_t cinfo;
    if (EXR_ERR_SUCCESS == exr_read_tile_chunk_info (
            _ctxt, _data->partNumber, dx, dy, lx, ly, &cinfo))
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (_data->_mx);
#endif
        _data->_tile_data_scratch.resize (cinfo.packed_size);
        pixelDataSize = static_cast<int> (cinfo.packed_size);
        if (EXR_ERR_SUCCESS !=
            exr_read_chunk (_ctxt, _data->partNumber, &cinfo,
                            _data->_tile_data_scratch.data ()))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                    << fileName () << "\". Unable to read raw tile data of "
                    << pixelDataSize << " bytes.");
        }
        pixelData = _data->_tile_data_scratch.data ();
        dx = cinfo.start_x;
        dy = cinfo.start_y;
        lx = cinfo.level_x;
        ly = cinfo.level_y;
    }
    else
    {
        if (!isValidTile (dx, dy, lx, ly))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading pixel data from image "
                "file \""
                << fileName () << "\". "
                << "Tried to read a tile outside "
                "the image file's data window.");
        }
        else
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading chunk information for tile from image "
                "file \""
                << fileName () << "\". Unable to read raw tile offset information.");
        }
    }
}